

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

GCstr * lj_lib_checkstr(lua_State *L,int narg)

{
  long lVar1;
  uint *puVar2;
  int in_ESI;
  long in_RDI;
  GCstr *s;
  TValue *o;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  GCstr *local_70;
  
  lVar1 = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  puVar2 = (uint *)(lVar1 + -8);
  if (puVar2 < *(uint **)(in_RDI + 0x18)) {
    if (*(int *)(lVar1 + -4) == -5) {
      local_70 = (GCstr *)(ulong)*puVar2;
    }
    else {
      if (0xfffeffff < *(uint *)(lVar1 + -4)) goto LAB_00120629;
      local_70 = lj_strfmt_number(in_stack_ffffffffffffff70,
                                  (cTValue *)
                                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      *puVar2 = (uint)local_70;
      *(undefined4 *)(lVar1 + -4) = 0xfffffffb;
    }
    return local_70;
  }
LAB_00120629:
  lj_err_argt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
}

Assistant:

GCstr *lj_lib_checkstr(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (LJ_LIKELY(tvisstr(o))) {
      return strV(o);
    } else if (tvisnumber(o)) {
      GCstr *s = lj_strfmt_number(L, o);
      setstrV(L, o, s);
      return s;
    }
  }
  lj_err_argt(L, narg, LUA_TSTRING);
  return NULL;  /* unreachable */
}